

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
          (PromiseDataBase<void,_void_()> *this,function<void_()> *handler)

{
  QWriteLocker lock;
  QWriteLocker local_50;
  QThread *local_48;
  pair<QPointer<QThread>,_std::function<void_()>_> local_40;
  
  local_50.q_val = (quintptr)&this->m_lock;
  QWriteLocker::relock(&local_50);
  local_48 = (QThread *)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_()>_>::
  pair<QThread_*,_std::function<void_()>,_true>(&local_40,&local_48,handler);
  QList<std::pair<QPointer<QThread>,std::function<void()>>>::
  emplaceBack<std::pair<QPointer<QThread>,std::function<void()>>>
            ((QList<std::pair<QPointer<QThread>,std::function<void()>>> *)&this->m_handlers,
             &local_40);
  std::pair<QPointer<QThread>,_std::function<void_()>_>::~pair(&local_40);
  QWriteLocker::~QWriteLocker(&local_50);
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }